

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManFromIfLogicAndVars
              (Gia_Man_t *pNew,If_Man_t *pIfMan,If_Cut_t *pCutBest,Vec_Int_t *vLeaves,
              Vec_Int_t *vLeaves2,Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Mem_t *pVVar4;
  If_Cut_t *pIVar5;
  word wVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int Fill;
  int Fill_00;
  undefined8 *__s;
  long lVar12;
  uint uVar13;
  uint uVar14;
  word *pwVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  word uTruth [2];
  int MaskOne [2];
  int pVarsAll [12];
  int pVarsThat [12];
  int pVarsThis [12];
  int iLitCofs [2];
  word pFunc [64];
  word local_708 [2];
  If_Cut_t *local_6f8;
  uint local_6f0 [2];
  ulong local_6e8;
  word local_6e0;
  ulong local_6d8;
  Vec_Int_t *local_6d0;
  uint auStack_6c8 [12];
  uint auStack_698 [12];
  uint auStack_668 [12];
  undefined8 local_638;
  word local_438 [64];
  word local_238 [65];
  
  local_6d0 = vCover;
  if (pCutBest->iCutFunc < 0) {
LAB_002124cb:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar1 = *(uint *)&pCutBest->field_0x1c;
  uVar13 = uVar1 >> 0x18;
  uVar10 = (ulong)uVar13;
  uVar14 = (uint)pCutBest->iCutFunc >> 1;
  if (pIfMan->vTtDecs[uVar10]->nSize <= (int)uVar14) {
LAB_002124ea:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar2 = pIfMan->vTtDecs[uVar10]->pArray[uVar14];
  local_6e8 = (ulong)(ushort)uVar2;
  uVar11 = uVar2 & 0xffff;
  uVar16 = uVar2 >> 0x10 & 0x3fff;
  local_6f0[0] = uVar11;
  local_6f0[1] = uVar16;
  if ((((int)uVar2 < 1) || (iVar3 = pIfMan->pPars->nLutSize, 0xd < iVar3)) ||
     ((int)(iVar3 - (iVar3 >> 0x1f) & 0xfffffffeU) < (int)uVar13)) {
    __assert_fail("Mask > 0 && nLeaves <= 2 * (pIfMan->pPars->nLutSize/2) && pIfMan->pPars->nLutSize <= 13"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x6c6,
                  "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  pVVar4 = pIfMan->vTtMem[uVar10];
  if (pVVar4 == (Vec_Mem_t *)0x0) {
    pwVar15 = (word *)0x0;
  }
  else {
    if (pVVar4->nEntries <= (int)uVar14) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar15 = pVVar4->ppPages[uVar14 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
              (ulong)(uVar14 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
  }
  uVar14 = pIfMan->nTruth6Words[uVar10];
  local_6f8 = pCutBest;
  if (uVar2 < 0x40000000) {
    if (0 < (int)uVar14) {
      memcpy(local_438,pwVar15,(ulong)uVar14 << 3);
    }
  }
  else if (0 < (int)uVar14) {
    uVar8 = 0;
    do {
      local_438[uVar8] = ~pwVar15[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar14 != uVar8);
  }
  uVar14 = Abc_TtBitCount8[uVar11 >> 8] + Abc_TtBitCount8[(ulong)uVar2 & 0xff];
  if (iVar3 / 2 < (int)uVar14) {
    __assert_fail("Abc_TtBitCount16(This) <= nSuppLim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc6a,"void Abc_TtDeriveBiDec(word *, int, int, int, int, word *, word *)");
  }
  local_6d8 = (ulong)(uint)(Abc_TtBitCount8[uVar16 >> 8] + Abc_TtBitCount8[uVar2 >> 0x10 & 0xff]);
  if (iVar3 / 2 < Abc_TtBitCount8[uVar16 >> 8] + Abc_TtBitCount8[uVar2 >> 0x10 & 0xff]) {
    __assert_fail("Abc_TtBitCount16(That) <= nSuppLim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc6b,"void Abc_TtDeriveBiDec(word *, int, int, int, int, word *, word *)");
  }
  local_708[0] = Abc_TtDeriveBiDecOne(local_438,uVar13,uVar2 & 0xffff);
  local_708[1] = Abc_TtDeriveBiDecOne(local_438,uVar13,uVar16);
  local_638 = local_708[0];
  uVar11 = 1 << ((char)(uVar1 >> 0x18) - 6U & 0x1f);
  if (uVar1 < 0x7000000) {
    uVar11 = 1;
  }
  __s = &local_638;
  uVar17 = 0;
  local_6e0 = local_708[1];
  memset(__s,0,0x200);
  pwVar15 = local_238;
  memset(pwVar15,0,0x200);
  local_238[0] = local_6e0;
  if (0xcffffff < uVar1) {
    __assert_fail("nVars <= 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc30,"int Abc_TtVerifyBiDec(word *, int, int, int, int, word, word)");
  }
  if (0xffffff < uVar1) {
    uVar8 = 0;
    do {
      auStack_6c8[uVar8] = (uint)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
    uVar17 = 0;
    uVar7 = 0;
    do {
      if (((uint)local_6e8 >> (uVar7 & 0x1f) & 1) != 0) {
        lVar9 = (long)(int)uVar17;
        uVar17 = uVar17 + 1;
        auStack_668[lVar9] = uVar7;
      }
      uVar7 = uVar7 + 1;
    } while (uVar13 != uVar7);
  }
  if (uVar17 != uVar14) {
    __assert_fail("k == nThis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc36,"int Abc_TtVerifyBiDec(word *, int, int, int, int, word, word)");
  }
  uVar17 = 0;
  if (0xffffff < uVar1) {
    uVar17 = 0;
    uVar7 = 0;
    do {
      if ((uVar16 >> (uVar7 & 0x1f) & 1) != 0) {
        lVar9 = (long)(int)uVar17;
        uVar17 = uVar17 + 1;
        auStack_698[lVar9] = uVar7;
      }
      uVar7 = uVar7 + 1;
    } while (uVar13 != uVar7);
  }
  uVar16 = (uint)local_6d8;
  if (uVar17 != uVar16) {
    __assert_fail("k == nThat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc3a,"int Abc_TtVerifyBiDec(word *, int, int, int, int, word, word)");
  }
  if (uVar14 != uVar13) {
    if ((int)uVar13 <= (int)uVar14) goto LAB_0021269c;
    uVar17 = 1 << ((char)uVar14 - 6U & 0x1f);
    if ((int)uVar14 < 7) {
      uVar17 = 1;
    }
    if (uVar17 != uVar11) {
      if ((int)uVar11 <= (int)uVar17) goto LAB_002126f9;
      if (0 < (int)uVar11) {
        lVar9 = 0;
        do {
          if (0 < (int)uVar17) {
            uVar8 = 0;
            do {
              __s[uVar8] = (&local_638)[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar17 != uVar8);
          }
          lVar9 = lVar9 + (int)uVar17;
          __s = __s + (int)uVar17;
        } while (lVar9 < (long)(ulong)uVar11);
      }
    }
  }
  if (uVar16 != uVar13) {
    if ((int)uVar13 <= (int)uVar16) {
LAB_0021269c:
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x47d,"void Abc_TtStretch6(word *, int, int)");
    }
    uVar17 = 1 << ((char)local_6d8 - 6U & 0x1f);
    if ((int)uVar16 < 7) {
      uVar17 = 1;
    }
    if (uVar17 != uVar11) {
      if ((int)uVar11 <= (int)uVar17) {
LAB_002126f9:
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x482,"void Abc_TtStretch6(word *, int, int)");
      }
      if (0 < (int)uVar11) {
        lVar9 = 0;
        do {
          if (0 < (int)uVar17) {
            uVar8 = 0;
            do {
              pwVar15[uVar8] = local_238[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar17 != uVar8);
          }
          lVar9 = lVar9 + (int)uVar17;
          pwVar15 = pwVar15 + (int)uVar17;
        } while (lVar9 < (long)(ulong)uVar11);
      }
    }
  }
  uVar17 = uVar14 - 1;
  if ((0xffffff < uVar1) && (uVar8 = uVar10, 0 < (int)uVar14)) {
    do {
      uVar18 = uVar8 - 1;
      if ((int)auStack_6c8[uVar18] <= (int)auStack_668[uVar17]) {
        if (auStack_6c8[uVar18] != auStack_668[uVar17]) goto LAB_00212547;
        if ((long)(int)uVar17 < (long)uVar18) {
          Abc_TtSwapVars(&local_638,uVar13,uVar17,(int)uVar18);
        }
        uVar17 = uVar17 - 1;
      }
    } while ((1 < (long)uVar8) && (uVar8 = uVar18, -1 < (int)uVar17));
  }
  if (uVar17 == 0xffffffff) {
    uVar14 = uVar16 - 1;
    if ((0xffffff < uVar1) && (0 < (int)uVar16)) {
      do {
        uVar8 = uVar10 - 1;
        if ((int)auStack_6c8[uVar8] <= (int)auStack_698[uVar14]) {
          if (auStack_6c8[uVar8] != auStack_698[uVar14]) {
LAB_00212547:
            __assert_fail("pCut[i] == pCut0[k]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x73c,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
          }
          if ((long)(int)uVar14 < (long)uVar8) {
            Abc_TtSwapVars(local_238,uVar13,uVar14,(int)uVar8);
          }
          uVar14 = uVar14 - 1;
        }
      } while ((1 < (long)uVar10) && (uVar10 = uVar8, -1 < (int)uVar14));
    }
    if (uVar14 == 0xffffffff) {
      uVar2 = uVar2 >> 0x1e;
      if (0 < (int)uVar11) {
        uVar10 = 0;
        do {
          if (local_438[uVar10] != (local_238[uVar10] & (&local_638)[uVar10])) {
            puts("Bi-decomposition verification failed.");
            break;
          }
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      local_708[0] = local_708[0] ^ (long)(int)-uVar2;
      local_708[1] = local_708[1] ^ (long)(int)-uVar2;
      lVar9 = 0;
      do {
        vLeaves2->nSize = 0;
        if (0xffffff < uVar1) {
          uVar14 = local_6f0[lVar9];
          uVar10 = 0;
          do {
            if ((uVar14 >> ((uint)uVar10 & 0x1f) & 1) != 0) {
              if ((long)vLeaves->nSize <= (long)uVar10) goto LAB_002124ea;
              Vec_IntPush(vLeaves2,vLeaves->pArray[uVar10]);
            }
            uVar10 = uVar10 + 1;
          } while (uVar13 != uVar10);
        }
        if (vLeaves2->nSize < 1) {
          __assert_fail("Vec_IntSize(vLeaves2) >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                        ,0x6d1,
                        "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        uVar14 = Kit_TruthToGia(pNew,(uint *)(local_708 + lVar9),vLeaves2->nSize,local_6d0,vLeaves2,
                                0);
        *(uint *)((long)&local_638 + lVar9 * 4) = uVar14;
        if (vLeaves2->nSize != 1) {
          if ((int)uVar14 < 0) goto LAB_002124cb;
          uVar14 = uVar14 >> 1;
          if (pNew->nObjs <= (int)uVar14) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar16 = (uint)*(undefined8 *)(pNew->pObjs + uVar14);
          if (((int)uVar16 < 0) || ((uVar16 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c])))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                          ,0x6d6,
                          "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar3 = vMapping2->nSize;
          Vec_IntFillExtra(vMapping,uVar14 + 1,Fill);
          if (vMapping->nSize <= (int)uVar14) goto LAB_00212528;
          vMapping->pArray[uVar14] = iVar3;
          Vec_IntPush(vMapping2,vLeaves2->nSize);
          if (0 < vLeaves2->nSize) {
            lVar12 = 0;
            do {
              if (vLeaves2->pArray[lVar12] < 0) goto LAB_002124cb;
              Vec_IntPush(vMapping2,(uint)vLeaves2->pArray[lVar12] >> 1);
              lVar12 = lVar12 + 1;
            } while (lVar12 < vLeaves2->nSize);
          }
          Vec_IntPush(vMapping2,uVar14);
        }
        wVar6 = local_638;
        pIVar5 = local_6f8;
        bVar19 = lVar9 != 0;
        lVar9 = lVar9 + 1;
        if (bVar19) {
          uVar1 = (uint)local_638;
          if (-1 < (int)(uint)local_638) {
            uVar14 = (uint)local_638 ^ uVar2;
            uVar13 = local_638._4_4_;
            local_638 = CONCAT44(local_638._4_4_,uVar14);
            if (-1 < (long)wVar6) {
              local_638._4_4_ = local_638._4_4_ ^ uVar2;
              local_638 = CONCAT44(local_638._4_4_,uVar14);
              uVar16 = Gia_ManAppendAnd(pNew,uVar14,local_638._4_4_);
              uVar14 = pIVar5->iCutFunc;
              if ((int)uVar14 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              if (-1 < (int)uVar16) {
                uVar11 = uVar16 >> 1;
                iVar3 = vMapping2->nSize;
                Vec_IntFillExtra(vMapping,uVar11 + 1,Fill_00);
                if ((int)uVar11 < vMapping->nSize) {
                  vMapping->pArray[uVar11] = iVar3;
                  Vec_IntPush(vMapping2,2);
                  Vec_IntPush(vMapping2,uVar1 >> 1);
                  Vec_IntPush(vMapping2,uVar13 >> 1);
                  Vec_IntPush(vMapping2,-uVar11);
                  return *(uint *)&local_6f8->field_0x1c >> 0xc & 1 ^ uVar16 ^
                         (uint)(uVar2 != (uVar14 & 1));
                }
LAB_00212528:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
            }
          }
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
      } while( true );
    }
  }
  __assert_fail("k == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x741,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
}

Assistant:

int Gia_ManFromIfLogicAndVars( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Cut_t * pCutBest, Vec_Int_t * vLeaves, Vec_Int_t * vLeaves2, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2 )
{
    word pFunc[64], uTruth[2];
    int nLeaves = pCutBest->nLeaves;
    int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
    int c, k, Mask = Vec_IntEntry(pIfMan->vTtDecs[nLeaves], truthId);
    int MaskOne[2] = { Mask & 0xFFFF, (Mask >> 16) & 0x3FFF };
    int iLitCofs[2], iTemp, fOrDec = (Mask >> 30) & 1, RetValue = -1; 
    assert( Mask > 0 && nLeaves <= 2 * (pIfMan->pPars->nLutSize/2) && pIfMan->pPars->nLutSize <= 13 );
    Abc_TtCopy( pFunc, If_CutTruthWR(pIfMan, pCutBest), pIfMan->nTruth6Words[nLeaves], fOrDec );
    Abc_TtDeriveBiDec( pFunc, nLeaves, MaskOne[0], MaskOne[1], pIfMan->pPars->nLutSize/2, &uTruth[0], &uTruth[1] );
    uTruth[0] = fOrDec ? ~uTruth[0] : uTruth[0];
    uTruth[1] = fOrDec ? ~uTruth[1] : uTruth[1];
    for ( c = 0; c < 2; c++ )
    {
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < nLeaves; k++ )
            if ( (MaskOne[c] >> k) & 1 )
                Vec_IntPush( vLeaves2, Vec_IntEntry(vLeaves, k) );
        assert( Vec_IntSize(vLeaves2) >= 1 );
        iLitCofs[c] = Kit_TruthToGia( pNew, (unsigned *)&uTruth[c], Vec_IntSize(vLeaves2), vCover, vLeaves2, 0 );
        if ( Vec_IntSize(vLeaves2) == 1 )
            continue;
        // create mapping
        assert( Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c]))) );
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitCofs[c]), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
        Vec_IntForEachEntry( vLeaves2, iTemp, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[c]) );
    }
    iLitCofs[0] = Abc_LitNotCond( iLitCofs[0], fOrDec );
    iLitCofs[1] = Abc_LitNotCond( iLitCofs[1], fOrDec );
    RetValue = Gia_ManAppendAnd( pNew, iLitCofs[0], iLitCofs[1] );
    RetValue = Abc_LitNotCond( RetValue, fOrDec ^ Abc_LitIsCompl(pCutBest->iCutFunc) );
    // create mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(RetValue), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, 2 );
    Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[0]) );
    Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[1]) );
    Vec_IntPush( vMapping2, -Abc_Lit2Var(RetValue) );
    RetValue = Abc_LitNotCond( RetValue, pCutBest->fCompl );
    return RetValue;
}